

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall gvr::Mesh::saveSTL(Mesh *this,char *name)

{
  undefined8 uVar1;
  _Ios_Iostate _Var2;
  Matrix33d *a;
  Vector3d *b;
  PointCloud *this_00;
  long lVar3;
  _Ios_Openmode in_ESI;
  Model *in_RDI;
  undefined1 auVar4 [16];
  float len;
  Vector3f vn;
  Vector3f v2;
  Vector3f v1;
  Vector3f v0;
  int i;
  uint *tp;
  Vector6d pose;
  ostringstream header;
  ofstream out;
  uint32_t in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  SVector<double,_6> *in_stack_fffffffffffffb58;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  SVector<float,_3> local_43c [4];
  int local_40c;
  double local_408;
  string local_400 [32];
  undefined1 local_3e0 [16];
  int local_3cc;
  ostringstream local_398 [392];
  long local_210 [64];
  _Ios_Openmode local_10;
  
  local_10 = in_ESI;
  std::ofstream::ofstream(local_210);
  uVar1 = *(undefined8 *)(local_210[0] + -0x18);
  _Var2 = std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_210 + (int)uVar1);
  std::ofstream::open((char *)local_210,local_10);
  std::__cxx11::ostringstream::ostringstream(local_398);
  std::operator<<((ostream *)local_398,"campose=");
  a = Model::getDefCameraR(in_RDI);
  b = Model::getDefCameraT(in_RDI);
  gmath::getPose((Matrix33d *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 (Vector3d *)CONCAT44(_Var2,in_stack_fffffffffffffba0));
  local_3cc = (int)std::setprecision(5);
  std::operator<<((ostream *)local_398,(_Setprecision)local_3cc);
  gmath::operator<<(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  while( true ) {
    auVar4 = std::ostream::tellp();
    local_3e0 = auVar4;
    this_00 = (PointCloud *)std::fpos::operator_cast_to_long((fpos *)local_3e0);
    if (0x4f < (long)this_00) break;
    std::operator<<((ostream *)local_398,' ');
  }
  std::__cxx11::ostringstream::str();
  lVar3 = std::__cxx11::string::c_str();
  std::ostream::write((char *)local_210,lVar3);
  std::__cxx11::string::~string(local_400);
  anon_unknown_10::stlWriteUint32
            ((ofstream *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb4c);
  local_408 = in_RDI[1].Rc.v[0][1];
  for (local_40c = 0; local_40c < *(int *)in_RDI[1].Rc.v[0]; local_40c = local_40c + 1) {
    PointCloud::getVertex(this_00,(int)in_stack_fffffffffffffb54);
    PointCloud::getVertex(this_00,(int)in_stack_fffffffffffffb54);
    PointCloud::getVertex(this_00,(int)in_stack_fffffffffffffb54);
    gmath::SVector<float,_3>::operator-(auVar4._0_8_,auVar4._8_8_);
    gmath::SVector<float,_3>::operator-(auVar4._0_8_,auVar4._8_8_);
    gmath::cross<float>((SVector<float,_3> *)a,(SVector<float,_3> *)b);
    in_stack_fffffffffffffb54 =
         gmath::norm<float,3>
                   ((SVector<float,_3> *)
                    CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    if (0.0 < in_stack_fffffffffffffb54) {
      gmath::SVector<float,_3>::operator/=(local_43c,in_stack_fffffffffffffb54);
    }
    anon_unknown_10::stlWriteVector3f(auVar4._8_8_,(Vector3f *)this_00);
    anon_unknown_10::stlWriteVector3f(auVar4._8_8_,(Vector3f *)this_00);
    anon_unknown_10::stlWriteVector3f(auVar4._8_8_,(Vector3f *)this_00);
    anon_unknown_10::stlWriteVector3f(auVar4._8_8_,(Vector3f *)this_00);
    anon_unknown_10::stlWriteUint16
              ((ofstream *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               (uint16_t)(in_stack_fffffffffffffb4c >> 0x10));
    local_408 = (double)((long)local_408 + 0xc);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::~ostringstream(local_398);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void Mesh::saveSTL(const char *name) const
{
  std::ofstream out;

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);

  // write header with camera definition

  std::ostringstream header;

  header << "campose=";
  gmath::Vector6d pose=gmath::getPose(getDefCameraR(), getDefCameraT());
  header << std::setprecision(5) << pose;

  while (header.tellp() < 80) header << ' ';

  out.write(header.str().c_str(), 80);

  // write number of triangles

  stlWriteUint32(out, static_cast<uint32_t>(n));

  unsigned int *tp=triangle;
  for (int i=0; i<n; i++)
  {
    // get vertices

    gmath::Vector3f v0=getVertex(tp[0]);
    gmath::Vector3f v1=getVertex(tp[1]);
    gmath::Vector3f v2=getVertex(tp[2]);

    // compute normal of triangle

    gmath::Vector3f vn=gmath::cross(v1-v0, v2-v0);
    float len=gmath::norm(vn);

    if (len > 0)
    {
      vn/=len;
    }

    // store normal

    stlWriteVector3f(out, vn);

    // store vertices

    stlWriteVector3f(out, v0);
    stlWriteVector3f(out, v1);
    stlWriteVector3f(out, v2);

    // store padding

    stlWriteUint16(out, 0);

    tp+=3;
  }

  out.close();
}